

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ray_tracing.cpp
# Opt level: O2

bool dxil_spv::emit_ray_query_proceed_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  uint in_EAX;
  Value *operand;
  Operation *this;
  ulong uStack_28;
  Id ray_object_id;
  
  uStack_28 = (ulong)in_EAX;
  operand = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  bVar1 = build_ray_query_object(impl,operand,&ray_object_id,(uint32_t *)0x0);
  if (bVar1) {
    this = Converter::Impl::allocate(impl,OpRayQueryProceedKHR,(Value *)instruction);
    Operation::add_id(this,ray_object_id);
    Converter::Impl::add(impl,this,false);
  }
  return bVar1;
}

Assistant:

bool emit_ray_query_proceed_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	spv::Id ray_object_id = 0;
	if (!build_ray_query_object(impl, instruction->getOperand(1), ray_object_id))
		return false;

	auto *op = impl.allocate(spv::OpRayQueryProceedKHR, instruction);
	op->add_id(ray_object_id);
	impl.add(op);
	return true;
}